

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void copy_recurse_data(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int type,
                      int stackptr,int stacktop,BOOL has_quit)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  sljit_compiler *compiler;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  sljit_sw sVar12;
  PCRE2_SPTR16 pPVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int load_base;
  PCRE2_SPTR16 cc_00;
  ulong uVar17;
  sljit_sw store_offset;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  sljit_sw private_srcw [2];
  sljit_sw shared_srcw [3];
  sljit_sw kept_shared_srcw [2];
  long local_118 [3];
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 local_f0;
  compiler_common *local_e8;
  ulong local_e0;
  PCRE2_SPTR16 local_d8;
  compiler_common *local_d0;
  ulong local_c8;
  uint local_bc;
  long local_b8 [4];
  long local_98 [3];
  compiler_common *local_80;
  delayed_mem_copy_status local_78;
  ulong local_38;
  
  local_f4 = stacktop;
  uVar19 = (ulong)(uint)type;
  local_80 = (compiler_common *)ccend;
  piVar7 = local_78.saved_tmp_regs + 1;
  pPVar13 = (PCRE2_SPTR16)0xc;
  iVar5 = 4;
  piVar10 = local_78.tmp_regs + 1;
  iVar18 = 4;
  if (2 < type - 1U) {
    bVar4 = true;
    if (type == 0) goto LAB_001557f7;
    piVar10 = local_78.saved_tmp_regs + 1;
    pPVar13 = (PCRE2_SPTR16)0x4;
    piVar7 = local_78.tmp_regs + 1;
    iVar18 = 5;
  }
  iVar5 = iVar18;
  bVar4 = false;
LAB_001557f7:
  local_78.tmp_regs[0] = 1;
  local_78.saved_tmp_regs[0] = 1;
  *piVar10 = iVar5;
  *piVar7 = iVar5;
  uVar14 = stackptr * 8;
  local_78.saved_tmp_regs[2] = 3;
  local_78.next_tmp_reg = 0;
  local_78.tmp_regs[2] = 3;
  local_78.store_bases[0] = -1;
  local_78.store_bases[1] = -1;
  local_78.store_bases[2] = -1;
  local_78.compiler = common->compiler;
  local_bc = type - 4U;
  iVar18 = (int)pPVar13;
  cc_00 = (PCRE2_SPTR16)&DAT_00000001;
  if ((type - 4U < 0xfffffffe) &&
     ((bVar4 || (delayed_mem_copy_move
                           (&local_78,iVar18,(ulong)uVar14,0xe,(long)common->recursive_head_ptr),
                cc_00 = pPVar13, type == 4)))) {
    cc_00 = (PCRE2_SPTR16)0xe;
    delayed_mem_copy_move(&local_78,0xe,(long)common->recursive_head_ptr,iVar18,(ulong)uVar14);
  }
  if (cc < local_80) {
    uVar15 = (ulong)(uVar14 + 8);
    local_f0 = 0;
    bVar3 = false;
    local_f8 = 0;
    local_fc = 0;
    local_e0 = uVar19;
    local_e8 = common;
    do {
      switch(*(short *)&((compiler_common *)cc)->compiler) {
      case 3:
        bVar20 = local_fc == 0;
        uVar14 = 0;
        if (bVar20 && local_f4 != 0) {
          local_98[0] = (long)common->ovector_start;
          local_fc = 1;
        }
        cc_00 = (PCRE2_SPTR16)(ulong)(bVar20 && local_f4 != 0);
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 2);
        uVar17 = 0;
        goto LAB_00155da3;
      default:
        cc = next_opcode((compiler_common *)cc,cc_00);
        uVar14 = 0;
        uVar17 = 0;
        break;
      case 0x21:
      case 0x23:
      case 0x2e:
      case 0x30:
      case 0x3b:
      case 0x3d:
      case 0x48:
      case 0x4a:
      case 0x5b:
      case 0x5c:
        lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar14 = 0;
        if (lVar8 != 0) {
          local_118[0] = lVar8;
          local_118[1] = lVar8 + 8;
          uVar14 = 2;
        }
        goto LAB_00155965;
      case 0x22:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x2f:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x3c:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x49:
      case 0x4b:
      case 0x4c:
      case 0x4d:
        lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar14 = 0;
        if (lVar8 != 0) {
LAB_00155927:
          local_118[0] = lVar8;
LAB_0015592c:
          uVar14 = 1;
        }
        goto LAB_00155965;
      case 0x27:
      case 0x28:
      case 0x34:
      case 0x35:
      case 0x41:
      case 0x42:
      case 0x4e:
      case 0x4f:
        lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar17 = 0;
        uVar14 = 0;
        if (lVar8 != 0) {
          local_118[0] = lVar8;
          local_118[1] = lVar8 + 8;
          uVar14 = 2;
        }
        goto LAB_00155b58;
      case 0x55:
      case 0x57:
        lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar14 = 0;
        if (lVar8 != 0) {
          local_118[0] = lVar8;
          local_118[1] = lVar8 + 8;
          uVar14 = 2;
        }
        goto LAB_00155c17;
      case 0x56:
      case 0x58:
      case 0x59:
      case 0x5a:
        lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar14 = 0;
        if (lVar8 != 0) {
          local_118[0] = lVar8;
          uVar14 = 1;
        }
LAB_00155c17:
        uVar17 = 0;
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 2);
        break;
      case 0x6e:
      case 0x6f:
      case 0x70:
        uVar9 = 0x11;
        if (*(short *)&((compiler_common *)cc)->compiler == 0x70) {
          uVar9 = (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2);
        }
        lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                              ((long)cc - (long)common->start) * 2);
        uVar17 = 0;
        uVar14 = 0;
        if (lVar8 != 0) {
          uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + uVar9 * 2);
          uVar16 = uVar1 - 0x62;
          uVar14 = 0;
          if (uVar16 < 8) {
            if ((0x3aU >> (uVar16 & 0x1f) & 1) != 0) goto LAB_00155aca;
            if ((5U >> (uVar16 & 0x1f) & 1) == 0) {
              uVar2 = *(ushort *)((long)&((compiler_common *)cc)->compiler + uVar9 * 2 + 4);
              if (uVar2 == 0) {
                if (uVar1 != 0x68) goto LAB_00155aca;
              }
              else {
                uVar16 = (uint)uVar2 -
                         (uint)*(ushort *)((long)&((compiler_common *)cc)->compiler + uVar9 * 2 + 2)
                ;
                if (1 < uVar16) {
                  uVar16 = 2;
                }
                if (uVar16 != 2) {
                  uVar14 = 0;
                  if (uVar16 != 1) goto LAB_00155d9d;
LAB_00155aca:
                  local_118[0] = lVar8;
                  uVar14 = 1;
                  goto LAB_00155d9d;
                }
              }
            }
            local_118[0] = lVar8;
            local_118[1] = lVar8 + 8;
            uVar14 = 2;
          }
        }
LAB_00155d9d:
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + uVar9 * 2);
        break;
      case 0x75:
        if (local_f4 == 0) {
          cc_00 = (PCRE2_SPTR16)0x0;
        }
        else {
          bVar21 = common->has_set_som != 0;
          bVar20 = local_fc == 0;
          if (bVar20 && bVar21) {
            local_98[0] = (long)common->ovector_start;
            local_fc = 1;
          }
          bVar20 = bVar20 && bVar21;
          cc_00 = (PCRE2_SPTR16)(ulong)bVar20;
          if (local_f8 == 0 && (long)common->mark_ptr != 0) {
            local_98[(long)cc_00] = (long)common->mark_ptr;
            cc_00 = (PCRE2_SPTR16)(ulong)(bVar20 + 1);
            local_f8 = 1;
          }
        }
        lVar8 = (long)common->capture_last_ptr;
        bVar20 = !bVar3;
        if (bVar20 && lVar8 != 0) {
          local_b8[0] = lVar8;
          bVar3 = true;
        }
        bVar20 = bVar20 && lVar8 != 0;
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 4);
        goto LAB_00155a3b;
      case 0x79:
        lVar8 = (long)cc - (long)common->start;
        lVar11 = (long)*(int *)((long)common->private_data_ptrs + lVar8 * 2);
        if (lVar11 != 0) {
          local_118[0] = lVar11;
          cc = (PCRE2_SPTR16)
               ((long)&((compiler_common *)cc)->compiler +
               (long)*(int *)((long)common->private_data_ptrs + lVar8 * 2 + 4) * 2);
          goto LAB_0015592c;
        }
        uVar14 = 0;
        goto LAB_00155965;
      case 0x7e:
      case 0x7f:
      case 0x80:
      case 0x81:
      case 0x82:
      case 0x84:
      case 0x88:
      case 0x89:
      case 0x8c:
        local_118[0] = (long)*(int *)((long)common->private_data_ptrs +
                                     ((long)cc - (long)common->start) * 2);
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 4);
        uVar17 = 0;
        uVar14 = 1;
        break;
      case 0x85:
      case 0x8a:
        uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + 4);
        local_b8[0] = (ulong)uVar1 * 0x10 + (long)common->ovector_start;
        local_b8[1] = (ulong)uVar1 * 0x10 + (long)common->ovector_start + 8;
        uVar17 = 2;
        if (!bVar3 && (long)common->capture_last_ptr != 0) {
          local_b8[2] = (long)common->capture_last_ptr;
          bVar3 = true;
          uVar17 = 3;
        }
        cc_00 = (PCRE2_SPTR16)0x0;
        bVar20 = common->optimized_cbracket[uVar1] == '\0';
        if (bVar20) {
          local_118[0] = (long)common->cbra_ptr + (ulong)uVar1 * 8;
        }
        uVar14 = (uint)bVar20;
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 6);
        goto LAB_00155da3;
      case 0x86:
      case 0x8b:
        uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + 4);
        lVar8 = (ulong)uVar1 * 0x10;
        local_b8[0] = lVar8 + common->ovector_start;
        local_b8[1] = lVar8 + common->ovector_start + 8;
        uVar14 = 2;
        uVar17 = 2;
        if (!bVar3 && (long)common->capture_last_ptr != 0) {
          local_b8[2] = (long)common->capture_last_ptr;
          bVar3 = true;
          uVar17 = 3;
        }
        local_118[0] = (long)*(int *)((long)common->private_data_ptrs +
                                     ((long)cc - (long)common->start) * 2);
        local_118[1] = (long)common->cbra_ptr + (ulong)uVar1 * 8;
LAB_00155b58:
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 6);
        break;
      case 0x87:
        uVar14 = 0;
        if ((*(ushort *)
              ((long)&((compiler_common *)cc)->compiler +
              (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2) & 0xfffe) ==
            0x7a) {
          lVar8 = (long)*(int *)((long)common->private_data_ptrs +
                                ((long)cc - (long)common->start) * 2);
          goto LAB_00155927;
        }
LAB_00155965:
        uVar17 = 0;
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 4);
        break;
      case 0x96:
      case 0x98:
      case 0x9c:
      case 0x9e:
        bVar20 = local_f8 == 0;
        if (bVar20 && local_f4 != 0) {
          local_98[0] = (long)common->mark_ptr;
          local_f8 = 1;
        }
        cc_00 = (PCRE2_SPTR16)(ulong)(bVar20 && local_f4 != 0);
        lVar8 = (long)common->control_head_ptr;
        bVar20 = (int)local_f0 == 0;
        if (bVar20 && lVar8 != 0) {
          local_b8[0] = lVar8;
          local_f0 = 1;
        }
        bVar20 = bVar20 && lVar8 != 0;
        cc = (PCRE2_SPTR16)
             ((long)&((compiler_common *)cc)->compiler +
             (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2 + 6);
LAB_00155a3b:
        uVar17 = (ulong)bVar20;
        uVar14 = 0;
        goto LAB_00155da3;
      case 0x9b:
        uVar14 = 0;
        if ((int)local_f0 == 0) {
          local_b8[0] = (long)common->control_head_ptr;
        }
        uVar17 = (ulong)((int)local_f0 == 0);
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 2);
        local_f0 = 1;
      }
      cc_00 = (PCRE2_SPTR16)0x0;
LAB_00155da3:
      if (local_bc < 0xfffffffe) {
        if (uVar14 != 0) {
          local_d8 = cc_00;
          local_38 = uVar17;
          local_d0 = (compiler_common *)cc;
          local_c8 = uVar15;
          uVar19 = 0;
          do {
            iVar5 = (int)uVar19 + (int)uVar15;
            if (bVar4) {
              sVar12 = *(sljit_sw *)((long)local_118 + uVar19);
LAB_00155e15:
              delayed_mem_copy_move(&local_78,0xe,sVar12,iVar18,(long)iVar5);
            }
            else {
              sVar12 = *(sljit_sw *)((long)local_118 + uVar19);
              delayed_mem_copy_move(&local_78,iVar18,(long)iVar5,0xe,sVar12);
              if (type == 4) goto LAB_00155e15;
            }
            uVar19 = uVar19 + 8;
          } while (uVar14 << 3 != uVar19);
          uVar15 = (ulong)(uint)((int)local_c8 + (int)uVar19);
          cc_00 = local_d8;
          uVar17 = local_38;
          uVar19 = local_e0;
          common = local_e8;
          cc = (PCRE2_SPTR16)local_d0;
        }
      }
      else {
        uVar15 = (ulong)((int)uVar15 + uVar14 * 8);
      }
      iVar5 = (int)uVar17;
      if (((uint)uVar19 | 2) == 3) {
        uVar15 = (ulong)(uint)((int)uVar15 + iVar5 * 8);
      }
      else if (0 < iVar5) {
        local_d8 = cc_00;
        local_d0 = (compiler_common *)cc;
        local_c8 = uVar15;
        uVar19 = 0;
        do {
          iVar6 = (int)uVar15 + (int)uVar19;
          if (bVar4) {
            sVar12 = *(sljit_sw *)((long)local_b8 + uVar19);
LAB_00155edb:
            delayed_mem_copy_move(&local_78,0xe,sVar12,iVar18,(long)iVar6);
          }
          else {
            sVar12 = *(sljit_sw *)((long)local_b8 + uVar19);
            delayed_mem_copy_move(&local_78,iVar18,(long)iVar6,0xe,sVar12);
            if (type == 4) goto LAB_00155edb;
          }
          uVar19 = uVar19 + 8;
        } while ((uint)(iVar5 << 3) != uVar19);
        uVar15 = (ulong)(uint)((int)local_c8 + (int)uVar19);
        cc_00 = local_d8;
        uVar19 = local_e0;
        common = local_e8;
        cc = (PCRE2_SPTR16)local_d0;
      }
      iVar5 = (int)uVar15;
      iVar6 = (int)cc_00;
      if (((int)uVar19 == 1) || ((int)uVar19 == 4)) {
        uVar15 = (ulong)(uint)(iVar5 + iVar6 * 8);
      }
      else if (0 < iVar6) {
        cc_00 = (PCRE2_SPTR16)(ulong)(uint)(iVar6 << 3);
        pPVar13 = (PCRE2_SPTR16)0x0;
        do {
          iVar6 = iVar5 + (int)pPVar13;
          if (bVar4) {
            sVar12 = *(sljit_sw *)((long)local_98 + (long)pPVar13);
            store_offset = (sljit_sw)iVar6;
            iVar6 = iVar18;
            load_base = 0xe;
          }
          else {
            sVar12 = (sljit_sw)iVar6;
            store_offset = *(sljit_sw *)((long)local_98 + (long)pPVar13);
            iVar6 = 0xe;
            load_base = iVar18;
          }
          delayed_mem_copy_move(&local_78,load_base,sVar12,iVar6,store_offset);
          pPVar13 = pPVar13 + 4;
        } while (cc_00 != pPVar13);
        uVar15 = (ulong)(uint)(iVar5 + (int)pPVar13);
        uVar19 = local_e0;
        common = local_e8;
      }
    } while (cc < local_80);
  }
  compiler = local_78.compiler;
  iVar5 = 3;
  iVar18 = local_78.next_tmp_reg;
  do {
    if (local_78.store_bases[iVar18] != 0xffffffff) {
      sljit_emit_op1(compiler,0x20,local_78.store_bases[iVar18] | 0x80,
                     (long)local_78.store_offsets[iVar18],local_78.tmp_regs[iVar18],0);
    }
    iVar18 = (iVar18 + 1) % 3;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

static void copy_recurse_data(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend,
  int type, int stackptr, int stacktop, BOOL has_quit)
{
delayed_mem_copy_status status;
PCRE2_SPTR alternative;
sljit_sw private_srcw[2];
sljit_sw shared_srcw[3];
sljit_sw kept_shared_srcw[2];
int private_count, shared_count, kept_shared_count;
int from_sp, base_reg, offset, i;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
BOOL capture_last_found = FALSE;
BOOL control_head_found = FALSE;

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
SLJIT_ASSERT(common->control_head_ptr != 0);
control_head_found = TRUE;
#endif

switch (type)
  {
  case recurse_copy_from_global:
  from_sp = TRUE;
  base_reg = STACK_TOP;
  break;

  case recurse_copy_private_to_global:
  case recurse_copy_shared_to_global:
  case recurse_copy_kept_shared_to_global:
  from_sp = FALSE;
  base_reg = STACK_TOP;
  break;

  default:
  SLJIT_ASSERT(type == recurse_swap_global);
  from_sp = FALSE;
  base_reg = TMP2;
  break;
  }

stackptr = STACK(stackptr);
stacktop = STACK(stacktop);

status.tmp_regs[0] = TMP1;
status.saved_tmp_regs[0] = TMP1;

if (base_reg != TMP2)
  {
  status.tmp_regs[1] = TMP2;
  status.saved_tmp_regs[1] = TMP2;
  }
else
  {
  status.saved_tmp_regs[1] = RETURN_ADDR;
  if (sljit_get_register_index (RETURN_ADDR) == -1)
    status.tmp_regs[1] = STR_PTR;
  else
    status.tmp_regs[1] = RETURN_ADDR;
  }

status.saved_tmp_regs[2] = TMP3;
if (sljit_get_register_index (TMP3) == -1)
  status.tmp_regs[2] = STR_END;
else
  status.tmp_regs[2] = TMP3;

delayed_mem_copy_init(&status, common);

if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
  {
  SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->recursive_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->recursive_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
if (type != recurse_copy_shared_to_global)
  {
  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->control_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->control_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);
#endif

while (cc < ccend)
  {
  private_count = 0;
  shared_count = 0;
  kept_shared_count = 0;

  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (has_quit && !setsom_found)
      {
      kept_shared_srcw[0] = OVECTOR(0);
      kept_shared_count = 1;
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_RECURSE:
    if (has_quit)
      {
      if (common->has_set_som && !setsom_found)
        {
        kept_shared_srcw[0] = OVECTOR(0);
        kept_shared_count = 1;
        setsom_found = TRUE;
        }
      if (common->mark_ptr != 0 && !setmark_found)
        {
        kept_shared_srcw[kept_shared_count] = common->mark_ptr;
        kept_shared_count++;
        setmark_found = TRUE;
        }
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[0] = common->capture_last_ptr;
      shared_count = 1;
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_KET:
    if (PRIVATE_DATA(cc) != 0)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      SLJIT_ASSERT(PRIVATE_DATA(cc + 1) != 0);
      cc += PRIVATE_DATA(cc + 1);
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ONCE:
    case OP_BRAPOS:
    case OP_SBRA:
    case OP_SBRAPOS:
    case OP_SCOND:
    private_count = 1;
    private_srcw[0] = PRIVATE_DATA(cc);
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_SCBRA:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    if (common->optimized_cbracket[GET2(cc, 1 + LINK_SIZE)] == 0)
      {
      private_count = 1;
      private_srcw[0] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
      }
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    private_count = 2;
    private_srcw[0] = PRIVATE_DATA(cc);
    private_srcw[1] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_COND:
    /* Might be a hidden SCOND. */
    alternative = cc + GET(cc, 1);
    if (*alternative == OP_KETRMAX || *alternative == OP_KETRMIN)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1 + LINK_SIZE;
    break;

    CASE_ITERATOR_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1 + IMM2_SIZE;
    break;

    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
    i = (*cc == OP_XCLASS) ? GET(cc, 1) : 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#else
    i = 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#endif
    if (PRIVATE_DATA(cc) != 0)
      switch(get_class_iterator_size(cc + i))
        {
        case 1:
        private_count = 1;
        private_srcw[0] = PRIVATE_DATA(cc);
        break;

        case 2:
        private_count = 2;
        private_srcw[0] = PRIVATE_DATA(cc);
        private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
        break;

        default:
        SLJIT_UNREACHABLE();
        break;
        }
    cc += i;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (has_quit && !setmark_found)
      {
      kept_shared_srcw[0] = common->mark_ptr;
      kept_shared_count = 1;
      setmark_found = TRUE;
      }
    if (common->control_head_ptr != 0 && !control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_THEN:
    SLJIT_ASSERT(common->control_head_ptr != 0);
    if (!control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc++;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

  if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

    for (i = 0; i < private_count; i++)
      {
      SLJIT_ASSERT(private_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, private_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, private_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * private_count;

  if (type != recurse_copy_private_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_swap_global);

    for (i = 0; i < shared_count; i++)
      {
      SLJIT_ASSERT(shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * shared_count;

  if (type != recurse_copy_private_to_global && type != recurse_swap_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_copy_kept_shared_to_global);

    for (i = 0; i < kept_shared_count; i++)
      {
      SLJIT_ASSERT(kept_shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, kept_shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, kept_shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * kept_shared_count;
  }